

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkingUtils.cpp
# Opt level: O0

unsigned_long GetHostByName(char *name)

{
  uint32_t uVar1;
  uint32_t local_24;
  hostent *phStack_20;
  in_addr a;
  hostent *h;
  unsigned_long result;
  char *name_local;
  
  h = (hostent *)0x0;
  phStack_20 = gethostbyname(name);
  if (phStack_20 != (hostent *)0x0) {
    memcpy(&local_24,*phStack_20->h_addr_list,(long)phStack_20->h_length);
    uVar1 = ntohl(local_24);
    h = (hostent *)(ulong)uVar1;
  }
  return (unsigned_long)h;
}

Assistant:

unsigned long GetHostByName( const char *name )
{
    unsigned long result = 0;

    struct hostent *h = gethostbyname( name );
    if( h ){
        struct in_addr a;
        std::memcpy( &a, h->h_addr_list[0], h->h_length );
        result = ntohl(a.s_addr);
    }

    return result;
}